

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_copy_to_file.cpp
# Opt level: O2

void __thiscall duckdb::LogicalCopyToFile::Serialize(LogicalCopyToFile *this,Serializer *serializer)

{
  copy_to_serialize_t p_Var1;
  type pFVar2;
  bool has_serialize;
  PreserveOrderType local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  Serializer::WriteProperty<std::__cxx11::string>(serializer,200,"file_path",&this->file_path);
  Serializer::WriteProperty<bool>(serializer,0xc9,"use_tmp_file",&this->use_tmp_file);
  Serializer::WriteProperty<duckdb::FilenamePattern>
            (serializer,0xca,"filename_pattern",&this->filename_pattern);
  Serializer::WriteProperty<duckdb::CopyOverwriteMode>
            (serializer,0xcb,"overwrite_or_ignore",&this->overwrite_mode);
  Serializer::WriteProperty<bool>(serializer,0xcc,"per_thread_output",&this->per_thread_output);
  Serializer::WriteProperty<bool>(serializer,0xcd,"partition_output",&this->partition_output);
  Serializer::WriteProperty<duckdb::vector<unsigned_long,true>>
            (serializer,0xce,"partition_columns",&this->partition_columns);
  Serializer::WriteProperty<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0xcf,"names",&this->names);
  Serializer::WriteProperty<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0xd0,"expected_types",&this->expected_types);
  Serializer::
  WriteProperty<duckdb::unique_ptr<duckdb::CopyInfo,std::default_delete<duckdb::CopyInfo>,true>>
            (serializer,0xd1,"copy_info",&this->copy_info);
  Serializer::WriteProperty<std::__cxx11::string>
            (serializer,0xd2,"function_name",&(this->function).super_Function.name);
  local_29 = (this->function).serialize != (copy_to_serialize_t)0x0;
  Serializer::WriteProperty<bool>(serializer,0xd3,"function_has_serialize",&local_29);
  if (local_29 == true) {
    (*serializer->_vptr_Serializer[2])(serializer,0xd4,"function_data");
    (*serializer->_vptr_Serializer[6])(serializer);
    p_Var1 = (this->function).serialize;
    pFVar2 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator*(&this->bind_data);
    (*p_Var1)(serializer,pFVar2,&this->function);
    (*serializer->_vptr_Serializer[7])(serializer);
    (*serializer->_vptr_Serializer[3])(serializer);
  }
  Serializer::WriteProperty<std::__cxx11::string>
            (serializer,0xd5,"file_extension",&this->file_extension);
  Serializer::WriteProperty<bool>(serializer,0xd6,"rotate",&this->rotate);
  Serializer::WriteProperty<duckdb::CopyFunctionReturnType>
            (serializer,0xd7,"return_type",&this->return_type);
  local_2a = true;
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xd8,"write_partition_columns",&this->write_partition_columns,&local_2a);
  local_2b = true;
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xd9,"write_empty_file",&this->write_empty_file,&local_2b);
  local_2c = AUTOMATIC;
  Serializer::WritePropertyWithDefault<duckdb::PreserveOrderType>
            (serializer,0xda,"preserve_order",&this->preserve_order,&local_2c);
  return;
}

Assistant:

void LogicalCopyToFile::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WriteProperty(200, "file_path", file_path);
	serializer.WriteProperty(201, "use_tmp_file", use_tmp_file);
	serializer.WriteProperty(202, "filename_pattern", filename_pattern);
	serializer.WriteProperty(203, "overwrite_or_ignore", overwrite_mode);
	serializer.WriteProperty(204, "per_thread_output", per_thread_output);
	serializer.WriteProperty(205, "partition_output", partition_output);
	serializer.WriteProperty(206, "partition_columns", partition_columns);
	serializer.WriteProperty(207, "names", names);
	serializer.WriteProperty(208, "expected_types", expected_types);
	serializer.WriteProperty(209, "copy_info", copy_info);

	// Serialize function
	serializer.WriteProperty(210, "function_name", function.name);

	bool has_serialize = function.serialize;
	serializer.WriteProperty(211, "function_has_serialize", has_serialize);
	if (has_serialize) {
		D_ASSERT(function.deserialize); // if serialize is set, deserialize should be set as well
		serializer.WriteObject(212, "function_data",
		                       [&](Serializer &obj) { function.serialize(obj, *bind_data, function); });
	}

	serializer.WriteProperty(213, "file_extension", file_extension);
	serializer.WriteProperty(214, "rotate", rotate);
	serializer.WriteProperty(215, "return_type", return_type);
	serializer.WritePropertyWithDefault(216, "write_partition_columns", write_partition_columns, true);
	serializer.WritePropertyWithDefault(217, "write_empty_file", write_empty_file, true);
	serializer.WritePropertyWithDefault(218, "preserve_order", preserve_order, PreserveOrderType::AUTOMATIC);
}